

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Texture2DSizeCase::iterate(Texture2DSizeCase *this)

{
  TestLog *pTVar1;
  RenderContext *context;
  pointer texCoord_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined4 extraout_var_02;
  char *description;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  RandomViewport viewport;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  RandomViewport local_1a0;
  Surface local_190;
  vector<float,_std::allocator<float>_> local_178;
  TestLog *local_160;
  long local_158;
  Surface local_150;
  Texture2DView local_138;
  undefined1 *local_124 [7];
  SurfaceAccess local_e8;
  ReferenceParams local_c8;
  undefined4 extraout_var_01;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_158 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_1a0,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),0x80,0x80,dVar4);
  tcu::Surface::Surface(&local_190,local_1a0.width,local_1a0.height);
  tcu::Surface::Surface(&local_150,local_1a0.width,local_1a0.height);
  local_160 = pTVar1;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar5 = CONCAT44(extraout_var_01,iVar3);
  bVar8 = 8 - *(char *)(lVar5 + 8);
  uVar10 = 0x1000000 << (8U - (char)*(int *)(lVar5 + 0x14) & 0x1f);
  if (*(int *)(lVar5 + 0x14) < 1) {
    uVar10 = 0;
  }
  uVar7 = 0x100 << (8U - *(char *)(lVar5 + 0xc) & 0x1f) | 1 << (bVar8 & 0x1f);
  uVar10 = 0x10000 << (8U - *(char *)(lVar5 + 0x10) & 0x1f) | uVar7 | uVar10;
  uVar9 = 1 << (bVar8 & 0x1f) & 0xff;
  if (0xf7 < uVar9) {
    uVar9 = 0xf8;
  }
  uVar7 = uVar7 >> 8 & 0xff;
  if (0xf7 < uVar7) {
    uVar7 = 0xf8;
  }
  uVar6 = uVar10 >> 0x10 & 0xff;
  if (0xf7 < uVar6) {
    uVar6 = 0xf8;
  }
  uVar10 = uVar10 >> 0x18;
  if (0xf7 < uVar10) {
    uVar10 = 0xf8;
  }
  dVar4 = 0x2601;
  if (this->m_useMipmaps != false) {
    dVar4 = 0x2700;
  }
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super_RenderParams.texType = TEXTURETYPE_2D;
  local_c8.super_RenderParams.samplerType = SAMPLERTYPE_FLOAT;
  local_124[0] = &DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_178,(Vec2 *)&local_c8,(Vec2 *)local_124);
  lVar5 = local_158;
  (**(code **)(local_158 + 0x1a00))(local_1a0.x,local_1a0.y,local_1a0.width,local_1a0.height);
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,dVar4);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSizeTests.cpp"
                  ,0x96);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_2D);
  context = this->m_renderCtx;
  local_124[0] = (undefined1 *)0x300000008;
  if ((void *)local_190.m_pixels.m_cap != (void *)0x0) {
    local_190.m_pixels.m_cap = (size_t)local_190.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_c8,(TextureFormat *)local_124,local_190.m_width,
             local_190.m_height,1,(void *)local_190.m_pixels.m_cap);
  glu::readPixels(context,local_1a0.x,local_1a0.y,(PixelBufferAccess *)&local_c8);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_e8,&local_150,(PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  texCoord_00 = local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_138.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  local_138.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  glu::mapGLSampler((Sampler *)local_124,0x812f,0x812f,dVar4,0x2600);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&local_c8,TEXTURETYPE_2D,(Sampler *)local_124,LODMODE_EXACT);
  glu::TextureTestUtil::sampleTexture(&local_e8,&local_138,texCoord_00,&local_c8);
  bVar2 = glu::TextureTestUtil::compareImages
                    (local_160,&local_150,&local_190,
                     (RGBA)(uVar10 * 0x1000000 + (uVar6 << 0x10 | uVar7 * 0x100 + uVar9) + 0x7070707
                           ));
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar2,description);
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_150);
  tcu::Surface::~Surface(&local_190);
  return STOP;
}

Assistant:

Texture2DSizeCase::IterateResult Texture2DSizeCase::iterate (void)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), 128, 128, deStringHash(getName()));
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	deUint32				wrapS			= GL_CLAMP_TO_EDGE;
	deUint32				wrapT			= GL_CLAMP_TO_EDGE;
	// Do not minify with GL_NEAREST. A large POT texture with a small POT render target will produce
	// indeterminate results.
	deUint32				minFilter		= m_useMipmaps ? GL_NEAREST_MIPMAP_NEAREST : GL_LINEAR;
	deUint32				magFilter		= GL_NEAREST;
	vector<float>			texCoord;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], ReferenceParams(TEXTURETYPE_2D, mapGLSampler(wrapS, wrapT, minFilter, magFilter)));

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}